

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FileDescriptor::DebugStringWithOptions_abi_cxx11_
          (FileDescriptor *this,DebugStringOptions *debug_string_options)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Type TVar4;
  size_type sVar5;
  FileDescriptor *pFVar6;
  ulong uVar7;
  size_type sVar8;
  FieldDescriptor *pFVar9;
  SourceLocationCommentPrinter *pSVar10;
  FileDescriptor *in_RSI;
  string *in_RDI;
  int i_5;
  Descriptor *containing_type;
  int i_4;
  int i_3;
  int i_2;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  int i_1;
  SourceLocationCommentPrinter package_comment;
  vector<int,_std::allocator<int>_> path_1;
  undefined1 in_stack_00000817;
  DebugStringOptions *in_stack_00000818;
  string *in_stack_00000820;
  int in_stack_0000082c;
  Descriptor *in_stack_00000830;
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> weak_dependencies;
  set<int,_std::less<int>,_std::allocator<int>_> public_dependencies;
  SourceLocationCommentPrinter comment_printer;
  SourceLocationCommentPrinter syntax_comment;
  vector<int,_std::allocator<int>_> path;
  string *contents;
  value_type_conflict *in_stack_ffffffffffffef78;
  string *value;
  SubstituteArg *in_stack_ffffffffffffef80;
  SourceLocationCommentPrinter *this_00;
  SubstituteArg *__x;
  SubstituteArg *this_01;
  SubstituteArg *__x_00;
  DebugStringOptions *in_stack_ffffffffffffefa0;
  SubstituteArg *options;
  undefined4 in_stack_ffffffffffffefa8;
  undefined4 in_stack_ffffffffffffefac;
  string *in_stack_ffffffffffffefb0;
  string *in_stack_ffffffffffffefb8;
  SourceLocationCommentPrinter *in_stack_ffffffffffffefc0;
  undefined8 in_stack_ffffffffffffefd8;
  Syntax syntax;
  string *in_stack_ffffffffffffefe8;
  undefined4 in_stack_ffffffffffffeff0;
  undefined4 in_stack_ffffffffffffeff4;
  SubstituteArg local_ed8;
  SubstituteArg local_ea8;
  SubstituteArg local_e78;
  SubstituteArg local_e48;
  SubstituteArg *in_stack_fffffffffffff1f8;
  SubstituteArg *in_stack_fffffffffffff200;
  SubstituteArg *in_stack_fffffffffffff208;
  undefined8 in_stack_fffffffffffff210;
  undefined8 in_stack_fffffffffffff218;
  DescriptorPool *in_stack_fffffffffffff220;
  undefined8 in_stack_fffffffffffff228;
  undefined4 in_stack_fffffffffffff230;
  undefined4 in_stack_fffffffffffff234;
  undefined8 in_stack_fffffffffffff238;
  SubstituteArg *in_stack_fffffffffffff240;
  SubstituteArg *in_stack_fffffffffffff248;
  SubstituteArg *in_stack_fffffffffffff250;
  SubstituteArg *in_stack_fffffffffffff258;
  DebugStringOptions *in_stack_fffffffffffff2a0;
  string *in_stack_fffffffffffff2a8;
  ServiceDescriptor *in_stack_fffffffffffff2b0;
  int local_cf4;
  SourceLocationCommentPrinter *local_cf0;
  int local_ce4;
  int local_cd4;
  int local_cb4;
  int local_c7c;
  SubstituteArg local_c78;
  SubstituteArg local_c48;
  SubstituteArg local_c18;
  SubstituteArg local_be8;
  undefined1 local_bb8 [96];
  SubstituteArg local_b58;
  SubstituteArg local_b28;
  SubstituteArg local_af8 [2];
  allocator local_a91;
  string local_a90 [188];
  undefined4 local_9d4;
  SubstituteArg local_9b8;
  SubstituteArg local_988;
  SubstituteArg local_958;
  SubstituteArg local_928;
  undefined1 local_8f8 [96];
  SubstituteArg local_898;
  SubstituteArg local_868;
  SubstituteArg local_838;
  DebugStringOptions *in_stack_fffffffffffff818;
  string *in_stack_fffffffffffff820;
  PrintLabelFlag in_stack_fffffffffffff828;
  int in_stack_fffffffffffff82c;
  FieldDescriptor *in_stack_fffffffffffff830;
  SubstituteArg local_7a8;
  SubstituteArg local_778;
  SubstituteArg local_748;
  undefined1 local_718 [96];
  SubstituteArg local_6b8;
  SubstituteArg local_688;
  SubstituteArg local_658 [2];
  SubstituteArg local_5f8;
  SubstituteArg local_5c8;
  SubstituteArg local_598;
  SubstituteArg local_568;
  undefined1 local_538 [96];
  SubstituteArg local_4d8;
  SubstituteArg local_4a8;
  SubstituteArg local_478 [2];
  int local_414;
  allocator local_3a9;
  string local_3a8 [184];
  SubstituteArg local_2f0;
  SubstituteArg local_2c0;
  SubstituteArg local_290;
  SubstituteArg local_260;
  undefined1 local_230 [96];
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  DebugStringOptions *in_stack_fffffffffffffe98;
  string *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeac;
  EnumDescriptor *in_stack_fffffffffffffeb0;
  allocator local_109;
  string local_108 [204];
  undefined4 local_3c;
  byte local_19;
  
  syntax = (Syntax)((ulong)in_stack_ffffffffffffefd8 >> 0x20);
  local_19 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x624554);
  local_3c = 0xc;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffef80,
             in_stack_ffffffffffffef78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"",&local_109);
  anon_unknown_1::SourceLocationCommentPrinter::SourceLocationCommentPrinter
            (in_stack_ffffffffffffefc0,(FileDescriptor *)in_stack_ffffffffffffefb8,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffefb0,
             (string *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8),
             in_stack_ffffffffffffefa0);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)
             CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),in_stack_ffffffffffffefe8
            );
  FileDescriptor::syntax(in_RSI);
  SyntaxName(syntax);
  strings::internal::SubstituteArg::SubstituteArg
            (in_stack_ffffffffffffef80,(char *)in_stack_ffffffffffffef78);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffffe90);
  strings::internal::SubstituteArg::SubstituteArg(&local_1a0);
  strings::internal::SubstituteArg::SubstituteArg(&local_1d0);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_230 + 0x30));
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_230);
  strings::internal::SubstituteArg::SubstituteArg(&local_260);
  strings::internal::SubstituteArg::SubstituteArg(&local_290);
  strings::internal::SubstituteArg::SubstituteArg(&local_2c0);
  strings::internal::SubstituteArg::SubstituteArg(&local_2f0);
  options = &local_2f0;
  __x_00 = &local_2c0;
  this_01 = &local_290;
  __x = &local_260;
  this_00 = (SourceLocationCommentPrinter *)local_230;
  value = (string *)(local_230 + 0x30);
  strings::SubstituteAndAppend
            ((string *)in_stack_fffffffffffff220,(char *)in_stack_fffffffffffff218,
             (SubstituteArg *)in_stack_fffffffffffff210,in_stack_fffffffffffff208,
             in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             (SubstituteArg *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
             (SubstituteArg *)in_stack_fffffffffffff238,in_stack_fffffffffffff240,
             in_stack_fffffffffffff248,in_stack_fffffffffffff250,in_stack_fffffffffffff258);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            (in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(this_00);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"",&local_3a9);
  anon_unknown_1::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::FileDescriptor>
            (in_stack_ffffffffffffefc0,(FileDescriptor *)in_stack_ffffffffffffefb8,
             in_stack_ffffffffffffefb0,
             (DebugStringOptions *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8));
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)
             CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),in_stack_ffffffffffffefe8
            );
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x624824);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x624831);
  std::set<int,std::less<int>,std::allocator<int>>::insert<int*>
            ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00,(int *)value,(int *)0x624852)
  ;
  std::set<int,std::less<int>,std::allocator<int>>::insert<int*>
            ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00,(int *)value,(int *)0x624875)
  ;
  for (local_414 = 0; iVar3 = local_414, iVar2 = dependency_count(in_RSI), iVar3 < iVar2;
      local_414 = local_414 + 1) {
    sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)this_01,(key_type *)__x);
    if (sVar5 == 0) {
      sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)this_01,(key_type *)__x);
      iVar3 = (int)((ulong)__x >> 0x20);
      if (sVar5 == 0) {
        pFVar6 = dependency((FileDescriptor *)this_01,iVar3);
        name_abi_cxx11_(pFVar6);
        strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)this_00,value);
        strings::internal::SubstituteArg::SubstituteArg(&local_838);
        strings::internal::SubstituteArg::SubstituteArg(&local_868);
        strings::internal::SubstituteArg::SubstituteArg(&local_898);
        strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_8f8 + 0x30));
        strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_8f8);
        strings::internal::SubstituteArg::SubstituteArg(&local_928);
        strings::internal::SubstituteArg::SubstituteArg(&local_958);
        strings::internal::SubstituteArg::SubstituteArg(&local_988);
        strings::internal::SubstituteArg::SubstituteArg(&local_9b8);
        options = &local_9b8;
        __x_00 = &local_988;
        this_01 = &local_958;
        __x = &local_928;
        this_00 = (SourceLocationCommentPrinter *)local_8f8;
        value = (string *)(local_8f8 + 0x30);
        strings::SubstituteAndAppend
                  ((string *)in_stack_fffffffffffff220,(char *)in_stack_fffffffffffff218,
                   (SubstituteArg *)in_stack_fffffffffffff210,in_stack_fffffffffffff208,
                   in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (SubstituteArg *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                   (SubstituteArg *)in_stack_fffffffffffff238,in_stack_fffffffffffff240,
                   in_stack_fffffffffffff248,in_stack_fffffffffffff250,in_stack_fffffffffffff258);
      }
      else {
        pFVar6 = dependency((FileDescriptor *)this_01,iVar3);
        name_abi_cxx11_(pFVar6);
        strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)this_00,value);
        strings::internal::SubstituteArg::SubstituteArg(local_658);
        strings::internal::SubstituteArg::SubstituteArg(&local_688);
        strings::internal::SubstituteArg::SubstituteArg(&local_6b8);
        strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_718 + 0x30));
        strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_718);
        strings::internal::SubstituteArg::SubstituteArg(&local_748);
        strings::internal::SubstituteArg::SubstituteArg(&local_778);
        strings::internal::SubstituteArg::SubstituteArg(&local_7a8);
        strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff828);
        options = (SubstituteArg *)&stack0xfffffffffffff828;
        __x_00 = &local_7a8;
        this_01 = &local_778;
        __x = &local_748;
        this_00 = (SourceLocationCommentPrinter *)local_718;
        value = (string *)(local_718 + 0x30);
        strings::SubstituteAndAppend
                  ((string *)in_stack_fffffffffffff220,(char *)in_stack_fffffffffffff218,
                   (SubstituteArg *)in_stack_fffffffffffff210,in_stack_fffffffffffff208,
                   in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                   (SubstituteArg *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                   (SubstituteArg *)in_stack_fffffffffffff238,in_stack_fffffffffffff240,
                   in_stack_fffffffffffff248,in_stack_fffffffffffff250,in_stack_fffffffffffff258);
      }
    }
    else {
      pFVar6 = dependency((FileDescriptor *)this_01,(int)((ulong)__x >> 0x20));
      name_abi_cxx11_(pFVar6);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)this_00,value);
      strings::internal::SubstituteArg::SubstituteArg(local_478);
      strings::internal::SubstituteArg::SubstituteArg(&local_4a8);
      strings::internal::SubstituteArg::SubstituteArg(&local_4d8);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_538 + 0x30));
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_538);
      strings::internal::SubstituteArg::SubstituteArg(&local_568);
      strings::internal::SubstituteArg::SubstituteArg(&local_598);
      strings::internal::SubstituteArg::SubstituteArg(&local_5c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_5f8);
      options = &local_5f8;
      __x_00 = &local_5c8;
      this_01 = &local_598;
      __x = &local_568;
      this_00 = (SourceLocationCommentPrinter *)local_538;
      value = (string *)(local_538 + 0x30);
      strings::SubstituteAndAppend
                ((string *)in_stack_fffffffffffff220,(char *)in_stack_fffffffffffff218,
                 (SubstituteArg *)in_stack_fffffffffffff210,in_stack_fffffffffffff208,
                 in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                 (SubstituteArg *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                 (SubstituteArg *)in_stack_fffffffffffff238,in_stack_fffffffffffff240,
                 in_stack_fffffffffffff248,in_stack_fffffffffffff250,in_stack_fffffffffffff258);
    }
  }
  package_abi_cxx11_(in_RSI);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x624e88);
    local_9d4 = 2;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this_00,(value_type_conflict *)value);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a90,"",&local_a91);
    anon_unknown_1::SourceLocationCommentPrinter::SourceLocationCommentPrinter
              (in_stack_ffffffffffffefc0,(FileDescriptor *)in_stack_ffffffffffffefb8,
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffefb0,
               (string *)CONCAT44(in_stack_ffffffffffffefac,in_stack_ffffffffffffefa8),
               (DebugStringOptions *)options);
    std::__cxx11::string::~string(local_a90);
    std::allocator<char>::~allocator((allocator<char> *)&local_a91);
    anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
              ((SourceLocationCommentPrinter *)
               CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0),
               in_stack_ffffffffffffefe8);
    package_abi_cxx11_(in_RSI);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)this_00,value);
    strings::internal::SubstituteArg::SubstituteArg(local_af8);
    strings::internal::SubstituteArg::SubstituteArg(&local_b28);
    strings::internal::SubstituteArg::SubstituteArg(&local_b58);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_bb8 + 0x30));
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_bb8);
    strings::internal::SubstituteArg::SubstituteArg(&local_be8);
    strings::internal::SubstituteArg::SubstituteArg(&local_c18);
    strings::internal::SubstituteArg::SubstituteArg(&local_c48);
    strings::internal::SubstituteArg::SubstituteArg(&local_c78);
    options = &local_c78;
    __x_00 = &local_c48;
    this_01 = &local_c18;
    __x = &local_be8;
    this_00 = (SourceLocationCommentPrinter *)local_bb8;
    value = (string *)(local_bb8 + 0x30);
    strings::SubstituteAndAppend
              ((string *)in_stack_fffffffffffff220,(char *)in_stack_fffffffffffff218,
               (SubstituteArg *)in_stack_fffffffffffff210,in_stack_fffffffffffff208,
               in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
               (SubstituteArg *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
               (SubstituteArg *)in_stack_fffffffffffff238,in_stack_fffffffffffff240,
               in_stack_fffffffffffff248,in_stack_fffffffffffff250,in_stack_fffffffffffff258);
    anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
              (in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
    anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(this_00);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  }
  FileDescriptor::options(in_RSI);
  pool(in_RSI);
  bVar1 = anon_unknown_1::FormatLineOptions
                    (in_stack_fffffffffffff234,(Message *)in_stack_fffffffffffff228,
                     in_stack_fffffffffffff220,(string *)in_stack_fffffffffffff218);
  if (bVar1) {
    std::__cxx11::string::append((char *)in_RDI);
  }
  for (local_c7c = 0; iVar3 = enum_type_count(in_RSI), local_c7c < iVar3; local_c7c = local_c7c + 1)
  {
    enum_type(in_RSI,local_c7c);
    EnumDescriptor::DebugString
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98);
    std::__cxx11::string::append((char *)in_RDI);
  }
  std::
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
         *)0x62526d);
  for (local_cb4 = 0; iVar3 = extension_count(in_RSI), local_cb4 < iVar3; local_cb4 = local_cb4 + 1)
  {
    extension(in_RSI,local_cb4);
    TVar4 = FieldDescriptor::type((FieldDescriptor *)this_01);
    if (TVar4 == TYPE_GROUP) {
      extension(in_RSI,local_cb4);
      FieldDescriptor::message_type((FieldDescriptor *)this_00);
      std::
      set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::insert((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                *)options,(value_type *)__x_00);
    }
  }
  for (local_cd4 = 0; iVar3 = message_type_count(in_RSI), local_cd4 < iVar3;
      local_cd4 = local_cd4 + 1) {
    message_type(in_RSI,local_cd4);
    sVar8 = std::
            set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ::count((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     *)this_01,(key_type *)__x);
    if (sVar8 == 0) {
      message_type(in_RSI,local_cd4);
      Descriptor::DebugString
                (in_stack_00000830,in_stack_0000082c,in_stack_00000820,in_stack_00000818,
                 (bool)in_stack_00000817);
      std::__cxx11::string::append((char *)in_RDI);
    }
  }
  local_ce4 = 0;
  while (iVar3 = local_ce4, iVar2 = service_count(in_RSI), iVar3 < iVar2) {
    service(in_RSI,local_ce4);
    ServiceDescriptor::DebugString
              (in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0);
    std::__cxx11::string::append((char *)in_RDI);
    local_ce4 = local_ce4 + 1;
  }
  local_cf0 = (SourceLocationCommentPrinter *)0x0;
  for (local_cf4 = 0; iVar3 = extension_count(in_RSI), local_cf4 < iVar3; local_cf4 = local_cf4 + 1)
  {
    pFVar9 = extension(in_RSI,local_cf4);
    pSVar10 = (SourceLocationCommentPrinter *)FieldDescriptor::containing_type(pFVar9);
    if (pSVar10 != local_cf0) {
      if (0 < local_cf4) {
        std::__cxx11::string::append((char *)in_RDI);
      }
      pFVar9 = extension(in_RSI,local_cf4);
      local_cf0 = (SourceLocationCommentPrinter *)FieldDescriptor::containing_type(pFVar9);
      in_stack_ffffffffffffefc0 = local_cf0;
      in_stack_ffffffffffffefb8 = Descriptor::full_name_abi_cxx11_((Descriptor *)local_cf0);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)this_00,value);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff2a8);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff278);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff248);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff218);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff1e8);
      strings::internal::SubstituteArg::SubstituteArg(&local_e48);
      strings::internal::SubstituteArg::SubstituteArg(&local_e78);
      strings::internal::SubstituteArg::SubstituteArg(&local_ea8);
      strings::internal::SubstituteArg::SubstituteArg(&local_ed8);
      this_00 = (SourceLocationCommentPrinter *)&stack0xfffffffffffff1e8;
      value = (string *)&stack0xfffffffffffff218;
      strings::SubstituteAndAppend
                ((string *)in_stack_fffffffffffff220,(char *)in_stack_fffffffffffff218,
                 (SubstituteArg *)in_stack_fffffffffffff210,in_stack_fffffffffffff208,
                 in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
                 (SubstituteArg *)CONCAT44(in_stack_fffffffffffff234,in_stack_fffffffffffff230),
                 (SubstituteArg *)in_stack_fffffffffffff238,in_stack_fffffffffffff240,
                 in_stack_fffffffffffff248,in_stack_fffffffffffff250,in_stack_fffffffffffff258);
    }
    extension(in_RSI,local_cf4);
    FieldDescriptor::DebugString
              (in_stack_fffffffffffff830,in_stack_fffffffffffff82c,in_stack_fffffffffffff828,
               in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  }
  iVar3 = extension_count(in_RSI);
  if (0 < iVar3) {
    std::__cxx11::string::append((char *)in_RDI);
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            (in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  local_19 = 1;
  std::
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~set((set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          *)0x625834);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x625841);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x62584e);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(this_00);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string FileDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  std::string contents;
  {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kSyntaxFieldNumber);
    SourceLocationCommentPrinter syntax_comment(this, path, "",
                                                debug_string_options);
    syntax_comment.AddPreComment(&contents);
    strings::SubstituteAndAppend(&contents, "syntax = \"$0\";\n\n",
                                 SyntaxName(syntax()));
    syntax_comment.AddPostComment(&contents);
  }

  SourceLocationCommentPrinter comment_printer(this, "", debug_string_options);
  comment_printer.AddPreComment(&contents);

  std::set<int> public_dependencies;
  std::set<int> weak_dependencies;
  public_dependencies.insert(public_dependencies_,
                             public_dependencies_ + public_dependency_count_);
  weak_dependencies.insert(weak_dependencies_,
                           weak_dependencies_ + weak_dependency_count_);

  for (int i = 0; i < dependency_count(); i++) {
    if (public_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import public \"$0\";\n",
                                   dependency(i)->name());
    } else if (weak_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import weak \"$0\";\n",
                                   dependency(i)->name());
    } else {
      strings::SubstituteAndAppend(&contents, "import \"$0\";\n",
                                   dependency(i)->name());
    }
  }

  if (!package().empty()) {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kPackageFieldNumber);
    SourceLocationCommentPrinter package_comment(this, path, "",
                                                 debug_string_options);
    package_comment.AddPreComment(&contents);
    strings::SubstituteAndAppend(&contents, "package $0;\n\n", package());
    package_comment.AddPostComment(&contents);
  }

  if (FormatLineOptions(0, options(), pool(), &contents)) {
    contents.append("\n");  // add some space if we had options
  }

  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(0, &contents, debug_string_options);
    contents.append("\n");
  }

  // Find all the 'group' type extensions; we will not output their nested
  // definitions (those will be done with their group field descriptor).
  std::set<const Descriptor*> groups;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < message_type_count(); i++) {
    if (groups.count(message_type(i)) == 0) {
      message_type(i)->DebugString(0, &contents, debug_string_options,
                                   /* include_opening_clause */ true);
      contents.append("\n");
    }
  }

  for (int i = 0; i < service_count(); i++) {
    service(i)->DebugString(&contents, debug_string_options);
    contents.append("\n");
  }

  const Descriptor* containing_type = nullptr;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) contents.append("}\n\n");
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                   containing_type->full_name());
    }
    extension(i)->DebugString(1, FieldDescriptor::PRINT_LABEL, &contents,
                              debug_string_options);
  }
  if (extension_count() > 0) contents.append("}\n\n");

  comment_printer.AddPostComment(&contents);

  return contents;
}